

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O3

IceTCommRequest create_request(void)

{
  IceTCommRequest __ptr;
  undefined8 *puVar1;
  int line;
  
  __ptr = (IceTCommRequest)malloc(0x10);
  if (__ptr == (IceTCommRequest)0x0) {
    line = 0x83;
  }
  else {
    __ptr->magic_number = 0xd7168b00;
    puVar1 = (undefined8 *)malloc(8);
    __ptr->internals = puVar1;
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = &ompi_request_null;
      return __ptr;
    }
    free(__ptr);
    line = 0x8c;
  }
  icetRaiseDiagnostic("Could not allocate memory for IceTCommRequest",0xfffffffc,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                      ,line);
  return (IceTCommRequest)0x0;
}

Assistant:

static IceTCommRequest create_request(void)
{
    IceTCommRequest request;

    request = (IceTCommRequest)malloc(sizeof(struct IceTCommRequestStruct));
    if (request == NULL) {
        icetRaiseError("Could not allocate memory for IceTCommRequest",
                       ICET_OUT_OF_MEMORY);
        return NULL;
    }

    request->magic_number = ICET_MPI_REQUEST_MAGIC_NUMBER;
    request->internals=malloc(sizeof(struct IceTMPICommRequestInternalsStruct));
    if (request->internals == NULL) {
        free(request);
        icetRaiseError("Could not allocate memory for IceTCommRequest",
                       ICET_OUT_OF_MEMORY);
        return NULL;
    }

    setMPIRequest(request, MPI_REQUEST_NULL);

    return request;
}